

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port(void)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  shared_ptr<SchemeFilePort> sVar2;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> local_50 [2];
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_28;
  undefined4 local_18;
  undefined1 local_11;
  shared_ptr<SchemeFilePort> *p;
  
  local_11 = 0;
  local_18 = 2;
  sVar2 = std::make_shared<SchemeFilePort,port_type_t>((port_type_t *)in_RDI);
  std::shared_ptr<std::istream>::
  shared_ptr<std::istream,SchemeFilePort::create_default_port()::__0,void>
            ((shared_ptr<std::istream> *)&local_28,&std::cin,
             sVar2.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  peVar1 = std::__shared_ptr_access<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            (&(peVar1->super_SchemePort).input_stream,&local_28);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_28);
  std::shared_ptr<std::ostream>::
  shared_ptr<std::ostream,SchemeFilePort::create_default_port()::__1,void>
            ((shared_ptr<std::ostream> *)local_50,&std::cout);
  peVar1 = std::__shared_ptr_access<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator=
            (&(peVar1->super_SchemePort).output_stream,local_50);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::~shared_ptr(local_50);
  sVar2.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<SchemeFilePort>)
         sVar2.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port()
{
    auto p = std::make_shared<SchemeFilePort>(port_type_t::IO);
    p->input_stream = std::shared_ptr<std::istream>(&std::cin, [](void*){});
    p->output_stream = std::shared_ptr<std::ostream>(&std::cout, [](void*){});
    return p;
}